

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O0

void __thiscall gutil::Exception::Exception(Exception *this,string *type,string *message)

{
  exception *__rhs;
  exception *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_38 [8];
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__Exception_001c4f10;
  __rhs = in_RDI + 8;
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::operator+(in_stack_ffffffffffffffb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

Exception::Exception(const std::string &type, const std::string &message): s(type+": "+message)
{
#if defined(DEBUG) && defined(__GNUC__)
  std::ostringstream os;
  void *ptr[64];
  int nptr=backtrace(ptr, 64);
  char **sym=backtrace_symbols(ptr, nptr);

  for (int i=1; i<nptr-1; i++)
  {
    os << sym[i] << "\n";
  }

  if (nptr > 1)
  {
    os << sym[nptr-1];
  }

  free(sym);

  bt=os.str();
#endif
}